

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_connect_on_close(intptr_t uuid,fio_protocol_s *pr_)

{
  if (pr_[1].ping != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    (*pr_[1].ping)(uuid,(fio_protocol_s *)pr_[1].on_ready);
  }
  if (pr_[1].on_shutdown != (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0) {
    fio_tls_destroy(pr_[1].on_shutdown);
  }
  fio_free(pr_);
  return;
}

Assistant:

static void fio_connect_on_close(intptr_t uuid, fio_protocol_s *pr_) {
  fio_connect_protocol_s *pr = (fio_connect_protocol_s *)pr_;
  if (pr->on_fail)
    pr->on_fail(uuid, pr->udata);
  if (pr->tls)
    fio_tls_destroy(pr->tls);
  fio_free(pr);
  (void)uuid;
}